

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

ParameterizedTestSuiteInfo<solitaire::colliders::TableauPileColliderCollidedCardTests> * __thiscall
testing::internal::ParameterizedTestSuiteRegistry::
GetTestSuitePatternHolder<solitaire::colliders::TableauPileColliderCollidedCardTests>
          (ParameterizedTestSuiteRegistry *this,char *test_suite_name,CodeLocation *code_location)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppPVar2;
  pointer ppPVar3;
  pointer pcVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ParameterizedTestSuiteInfo<solitaire::colliders::TableauPileColliderCollidedCardTests> *this_00;
  pointer ppPVar7;
  CodeLocation local_88;
  ParameterizedTestSuiteInfo<solitaire::colliders::TableauPileColliderCollidedCardTests> *local_60;
  CodeLocation local_58;
  
  ppPVar2 = (this->test_suite_infos_).
            super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppPVar3 = (this->test_suite_infos_).
            super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppPVar2 == ppPVar3) {
    this_00 = (ParameterizedTestSuiteInfo<solitaire::colliders::TableauPileColliderCollidedCardTests>
               *)0x0;
  }
  else {
    this_00 = (ParameterizedTestSuiteInfo<solitaire::colliders::TableauPileColliderCollidedCardTests>
               *)0x0;
    do {
      ppPVar7 = ppPVar2 + 1;
      iVar5 = (*(*ppPVar2)->_vptr_ParameterizedTestSuiteInfoBase[2])();
      iVar5 = std::__cxx11::string::compare((char *)CONCAT44(extraout_var,iVar5));
      if (iVar5 == 0) {
        iVar6 = (*(*ppPVar2)->_vptr_ParameterizedTestSuiteInfoBase[3])();
        if ((undefined1 *)CONCAT44(extraout_var_00,iVar6) !=
            &TypeIdHelper<solitaire::colliders::TableauPileColliderCollidedCardTests>::dummy_) {
          local_58.file._M_dataplus._M_p = (pointer)&local_58.file.field_2;
          pcVar4 = (code_location->file)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_58,pcVar4,pcVar4 + (code_location->file)._M_string_length);
          local_58.line = code_location->line;
          ReportInvalidTestSuiteType(test_suite_name,&local_58);
          CodeLocation::~CodeLocation(&local_58);
          posix::Abort();
        }
        this_00 = CheckedDowncastToActualType<testing::internal::ParameterizedTestSuiteInfo<solitaire::colliders::TableauPileColliderCollidedCardTests>,testing::internal::ParameterizedTestSuiteInfoBase>
                            (*ppPVar2);
      }
    } while ((iVar5 != 0) && (ppPVar2 = ppPVar7, ppPVar7 != ppPVar3));
  }
  if (this_00 ==
      (ParameterizedTestSuiteInfo<solitaire::colliders::TableauPileColliderCollidedCardTests> *)0x0)
  {
    this_00 = (ParameterizedTestSuiteInfo<solitaire::colliders::TableauPileColliderCollidedCardTests>
               *)operator_new(0x80);
    paVar1 = &local_88.file.field_2;
    pcVar4 = (code_location->file)._M_dataplus._M_p;
    local_88.file._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar4,pcVar4 + (code_location->file)._M_string_length);
    local_88.line = code_location->line;
    ParameterizedTestSuiteInfo<solitaire::colliders::TableauPileColliderCollidedCardTests>::
    ParameterizedTestSuiteInfo(this_00,test_suite_name,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.file._M_dataplus._M_p != paVar1) {
      operator_delete(local_88.file._M_dataplus._M_p,local_88.file.field_2._M_allocated_capacity + 1
                     );
    }
    local_60 = this_00;
    std::
    vector<testing::internal::ParameterizedTestSuiteInfoBase*,std::allocator<testing::internal::ParameterizedTestSuiteInfoBase*>>
    ::emplace_back<testing::internal::ParameterizedTestSuiteInfoBase*>
              ((vector<testing::internal::ParameterizedTestSuiteInfoBase*,std::allocator<testing::internal::ParameterizedTestSuiteInfoBase*>>
                *)this,(ParameterizedTestSuiteInfoBase **)&local_60);
  }
  return this_00;
}

Assistant:

ParameterizedTestSuiteInfo<TestSuite>* GetTestSuitePatternHolder(
      const char* test_suite_name, CodeLocation code_location) {
    ParameterizedTestSuiteInfo<TestSuite>* typed_test_info = nullptr;
    for (auto& test_suite_info : test_suite_infos_) {
      if (test_suite_info->GetTestSuiteName() == test_suite_name) {
        if (test_suite_info->GetTestSuiteTypeId() != GetTypeId<TestSuite>()) {
          // Complain about incorrect usage of Google Test facilities
          // and terminate the program since we cannot guaranty correct
          // test suite setup and tear-down in this case.
          ReportInvalidTestSuiteType(test_suite_name, code_location);
          posix::Abort();
        } else {
          // At this point we are sure that the object we found is of the same
          // type we are looking for, so we downcast it to that type
          // without further checks.
          typed_test_info = CheckedDowncastToActualType<
              ParameterizedTestSuiteInfo<TestSuite> >(test_suite_info);
        }
        break;
      }
    }
    if (typed_test_info == nullptr) {
      typed_test_info = new ParameterizedTestSuiteInfo<TestSuite>(
          test_suite_name, code_location);
      test_suite_infos_.push_back(typed_test_info);
    }
    return typed_test_info;
  }